

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::Attribute_Access<std::function<int_(int)>,_TestBaseType>::Attribute_Access
          (Attribute_Access<std::function<int_(int)>,_TestBaseType> *this,
          offset_in_TestBaseType_to_function<int_(int)> t_attr)

{
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_61;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_60;
  Type_Info local_48;
  pointer_____offset_0x10___ *ppuStack_30;
  pointer_____offset_0x10___ *local_28;
  undefined8 uStack_20;
  
  param_types();
  Proxy_Function_Base::Proxy_Function_Base
            (&this->super_Proxy_Function_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_60,1);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&local_60);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Attribute_Access_001ac000;
  local_28 = &TestBaseType::typeinfo;
  uStack_20 = 0;
  local_48.m_flags = 0;
  local_48._20_4_ = 0;
  ppuStack_30 = &TestBaseType::typeinfo;
  local_48.m_type_info = (type_info *)&std::function<int(int)>::typeinfo;
  local_48.m_bare_type_info = (type_info *)&std::function<int(int)>::typeinfo;
  __l._M_len = 2;
  __l._M_array = &local_48;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&this->m_param_types,__l,&local_61);
  this->m_attr = t_attr;
  return;
}

Assistant:

explicit Attribute_Access(T Class::*t_attr)
          : Proxy_Function_Base(param_types(), 1)
          , m_attr(t_attr) {
      }